

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void relational_suite::compare_u16string_with_null(void)

{
  undefined1 local_389;
  basic_variable<std::allocator<char>_> local_388;
  basic_variable<std::allocator<char>_> local_358;
  undefined1 local_31b [2];
  undefined1 local_319;
  basic_variable<std::allocator<char>_> local_318;
  basic_variable<std::allocator<char>_> local_2e8;
  undefined1 local_2ab [2];
  undefined1 local_2a9;
  basic_variable<std::allocator<char>_> local_2a8;
  basic_variable<std::allocator<char>_> local_278;
  undefined1 local_23b [2];
  undefined1 local_239;
  basic_variable<std::allocator<char>_> local_238;
  basic_variable<std::allocator<char>_> local_208;
  undefined1 local_1cb [2];
  undefined1 local_1c9;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15b [2];
  undefined1 local_159;
  basic_variable<std::allocator<char>_> local_158;
  basic_variable<std::allocator<char>_> local_128;
  undefined1 local_eb [2];
  undefined1 local_e9;
  basic_variable<std::allocator<char>_> local_e8;
  basic_variable<std::allocator<char>_> local_b8;
  undefined1 local_87 [2];
  undefined1 local_85 [13];
  basic_variable<std::allocator<char>_> local_78;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_78);
  local_a[0] = trial::dynamic::operator<(&local_48,&local_78);
  local_85[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(u\"\") < variable()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1d50,"void relational_suite::compare_u16string_with_null()",local_a,local_85);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_b8,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_e8);
  local_87[0] = trial::dynamic::operator<=(&local_b8,&local_e8);
  local_e9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(u\"\") <= variable()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1d51,"void relational_suite::compare_u16string_with_null()",local_87,&local_e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_128,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_158);
  local_eb[0] = trial::dynamic::operator>(&local_128,&local_158);
  local_159 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(u\"\") > variable()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1d52,"void relational_suite::compare_u16string_with_null()",local_eb,&local_159);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_128);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_198,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_1c8);
  local_15b[0] = trial::dynamic::operator>=(&local_198,&local_1c8);
  local_1c9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(u\"\") >= variable()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1d53,"void relational_suite::compare_u16string_with_null()",local_15b,&local_1c9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_208,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_238);
  local_1cb[0] = trial::dynamic::operator<(&local_208,&local_238);
  local_239 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(u\"charlie\") < variable()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1d55,"void relational_suite::compare_u16string_with_null()",local_1cb,&local_239);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_238);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_208);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_278,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_2a8);
  local_23b[0] = trial::dynamic::operator<=(&local_278,&local_2a8);
  local_2a9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(u\"charlie\") <= variable()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1d56,"void relational_suite::compare_u16string_with_null()",local_23b,&local_2a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_278);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_2e8,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_318);
  local_2ab[0] = trial::dynamic::operator>(&local_2e8,&local_318);
  local_319 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(u\"charlie\") > variable()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1d57,"void relational_suite::compare_u16string_with_null()",local_2ab,&local_319);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_358,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_388);
  local_31b[0] = trial::dynamic::operator>=(&local_358,&local_388);
  local_389 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(u\"charlie\") >= variable()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1d58,"void relational_suite::compare_u16string_with_null()",local_31b,&local_389);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_388);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_358);
  return;
}

Assistant:

void compare_u16string_with_null()
{
    TRIAL_PROTOCOL_TEST_EQUAL(variable(u"") < variable(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(u"") <= variable(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(u"") > variable(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(u"") >= variable(), true);

    TRIAL_PROTOCOL_TEST_EQUAL(variable(u"charlie") < variable(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(u"charlie") <= variable(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(u"charlie") > variable(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(u"charlie") >= variable(), true);
}